

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmorpher.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1a4727::VmorpherState::deviceUpdate(VmorpherState *this,ALCdevice *param_1)

{
  undefined8 *puVar1;
  float *pfVar2;
  float *pfVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  
  pfVar2 = &this->mChans[0].Formants[0][0].mS1;
  pfVar3 = &this->mChans[0].Formants[1][0].mS1;
  lVar4 = 0x20;
  lVar5 = 0;
  do {
    uVar6 = lVar5 << 8 | 0xa0;
    lVar7 = 0;
    do {
      *(undefined8 *)((long)pfVar2 + lVar7) = 0;
      lVar7 = lVar7 + 0x10;
    } while (lVar7 != 0x40);
    lVar7 = 0;
    do {
      *(undefined8 *)((long)pfVar3 + lVar7) = 0;
      lVar7 = lVar7 + 0x10;
    } while (lVar7 != 0x40);
    puVar1 = (undefined8 *)((long)&this->mChans[0].Formants[0][1].mCoeff + uVar6);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)&this->mChans[0].Formants[0][0].mCoeff + uVar6);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)(this->mChans[0].Formants + -1) + 0x30 + uVar6);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)(this->mChans[0].Formants + -1) + 0x20 + uVar6);
    *puVar1 = 0;
    puVar1[1] = 0;
    lVar4 = lVar4 + 0x100;
    lVar5 = lVar5 + 1;
    pfVar2 = pfVar2 + 0x40;
    pfVar3 = pfVar3 + 0x40;
  } while (lVar4 != 0x1020);
  return;
}

Assistant:

void VmorpherState::deviceUpdate(const ALCdevice* /*device*/)
{
    for(auto &e : mChans)
    {
        std::for_each(std::begin(e.Formants[VOWEL_A_INDEX]), std::end(e.Formants[VOWEL_A_INDEX]),
            std::mem_fn(&FormantFilter::clear));
        std::for_each(std::begin(e.Formants[VOWEL_B_INDEX]), std::end(e.Formants[VOWEL_B_INDEX]),
            std::mem_fn(&FormantFilter::clear));
        std::fill(std::begin(e.CurrentGains), std::end(e.CurrentGains), 0.0f);
    }
}